

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_list.cpp
# Opt level: O1

PGList * duckdb_libpgquery::list_truncate(PGList *list,int new_size)

{
  int iVar1;
  PGListCell *pPVar2;
  
  iVar1 = 0;
  if (new_size < 1) {
    return (PGList *)0x0;
  }
  if (list != (PGList *)0x0) {
    iVar1 = list->length;
  }
  if (new_size < iVar1) {
    iVar1 = new_size;
    if (list == (PGList *)0x0) {
      pPVar2 = (PGListCell *)0x0;
    }
    else {
      pPVar2 = list->head;
    }
    for (; pPVar2 != (PGListCell *)0x0; pPVar2 = pPVar2->next) {
      if (iVar1 + -1 == 0) {
        pPVar2->next = (PGListCell *)0x0;
        list->tail = pPVar2;
        list->length = new_size;
        return list;
      }
      iVar1 = iVar1 + -1;
    }
  }
  return list;
}

Assistant:

PGList *
list_truncate(PGList *list, int new_size)
{
	PGListCell   *cell;
	int			n;

	if (new_size <= 0)
		return NIL;				/* truncate to zero length */

	/* If asked to effectively extend the list, do nothing */
	if (new_size >= list_length(list))
		return list;

	n = 1;
	foreach(cell, list)
	{
		if (n == new_size)
		{
			cell->next = NULL;
			list->tail = cell;
			list->length = new_size;
			check_list_invariants(list);
			return list;
		}
		n++;
	}

	/* keep the compiler quiet; never reached */
	Assert(false);
	return list;
}